

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

StringEqualsMatcher *
Catch::Matchers::Equals
          (StringEqualsMatcher *__return_storage_ptr__,string *str,CaseSensitive caseSensitivity)

{
  CasedString local_48;
  CaseSensitive local_1c;
  string *psStack_18;
  CaseSensitive caseSensitivity_local;
  string *str_local;
  
  local_1c = caseSensitivity;
  psStack_18 = str;
  str_local = (string *)__return_storage_ptr__;
  CasedString::CasedString(&local_48,str,caseSensitivity);
  StringEqualsMatcher::StringEqualsMatcher(__return_storage_ptr__,&local_48);
  CasedString::~CasedString(&local_48);
  return __return_storage_ptr__;
}

Assistant:

StringEqualsMatcher Equals(std::string const &str, CaseSensitive caseSensitivity) {
            return StringEqualsMatcher(CasedString(str, caseSensitivity));
        }